

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# light_pcapng_ext.c
# Opt level: O2

light_pcapng_t * light_pcapng_open_append(char *file_path)

{
  light_pcapng_t *plVar1;
  light_pcapng pcapng;
  __fd_t pFVar2;
  undefined8 uVar3;
  
  if (file_path == (char *)0x0) {
    uVar3 = 0x109;
  }
  else {
    plVar1 = light_pcapng_open_read(file_path,LIGHT_TRUE);
    if (plVar1 != (light_pcapng_t *)0x0) {
      for (pcapng = plVar1->pcapng; pcapng != (light_pcapng)0x0; pcapng = light_next_block(pcapng))
      {
        plVar1->pcapng_iter = pcapng;
      }
      pFVar2 = light_open(file_path,LIGHT_OAPPEND);
      plVar1->file = pFVar2;
      return plVar1;
    }
    uVar3 = 0x10c;
  }
  fprintf(_stderr,"NULL pointer ERROR at %s::%s::%d\n",
          "/workspace/llm4binary/github/license_c_cmakelists/rvelea[P]LightPcapNg/src/light_pcapng_ext.c"
          ,"light_pcapng_open_append",uVar3);
  return (light_pcapng_t *)0x0;
}

Assistant:

light_pcapng_t *light_pcapng_open_append(const char* file_path)
{
	DCHECK_NULLP(file_path, return NULL);

	light_pcapng_t *pcapng = light_pcapng_open_read(file_path, LIGHT_TRUE);
	DCHECK_NULLP(pcapng, return NULL);

	light_pcapng iter = pcapng->pcapng;
	while (iter != NULL)
	{
		pcapng->pcapng_iter = iter;
		iter = light_next_block(iter);
	}

	pcapng->file = light_open(file_path, LIGHT_OAPPEND);

	return pcapng;
}